

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O2

void cf_chacha20_init_custom
               (cf_chacha20_ctx *ctx,uint8_t *key,size_t nkey,uint8_t *nonce,size_t ncounter)

{
  undefined8 uVar1;
  
  if (ncounter != 0) {
    set_key(ctx,key,nkey);
    uVar1 = *(undefined8 *)(nonce + 8);
    *(undefined8 *)ctx->nonce = *(undefined8 *)nonce;
    *(undefined8 *)(ctx->nonce + 8) = uVar1;
    ctx->nblock = 0;
    ctx->ncounter = ncounter;
    return;
  }
  abort();
}

Assistant:

void cf_chacha20_init_custom(cf_chacha20_ctx *ctx, const uint8_t *key, size_t nkey,
                             const uint8_t nonce[16], size_t ncounter)
{
  assert(ncounter > 0);
  set_key(ctx, key, nkey);
  memcpy(ctx->nonce, nonce, sizeof ctx->nonce);
  ctx->nblock = 0;
  ctx->ncounter = ncounter;
}